

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write_int<__int128>(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    *this,__int128 value,format_specs *spec)

{
  undefined1 value_00 [16];
  undefined8 *in_RDI;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> w;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>
  *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff78;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>
  *in_stack_ffffffffffffff88;
  locale_ref in_stack_ffffffffffffffa8;
  buffer_appender<char> in_stack_ffffffffffffffb0;
  
  value_00._8_8_ = in_stack_ffffffffffffff78;
  value_00._0_8_ = *in_RDI;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::int_writer<__int128>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (__int128)value_00,(basic_format_specs<char> *)in_RDI[1]);
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>&>
            ((char)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffff48);
  *in_RDI = in_stack_ffffffffffffff78;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }